

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

int abuf_memcpy(autobuf *autobuf,void *p,size_t len)

{
  int iVar1;
  size_t len_local;
  void *p_local;
  autobuf *autobuf_local;
  
  if ((autobuf == (autobuf *)0x0) || (len == 0)) {
    autobuf_local._4_4_ = 0;
  }
  else {
    iVar1 = _autobuf_enlarge(autobuf,autobuf->_len + len);
    if (iVar1 < 0) {
      autobuf_local._4_4_ = -1;
    }
    else {
      memcpy(autobuf->_buf + autobuf->_len,p,len);
      autobuf->_len = len + autobuf->_len;
      autobuf->_buf[autobuf->_len] = '\0';
      autobuf_local._4_4_ = 0;
    }
  }
  return autobuf_local._4_4_;
}

Assistant:

int
abuf_memcpy(struct autobuf *autobuf, const void *p, const size_t len) {
  if (autobuf == NULL || len == 0)
    return 0;

  if (_autobuf_enlarge(autobuf, autobuf->_len + len) < 0) {
    return -1;
  }
  memcpy(autobuf->_buf + autobuf->_len, p, len);
  autobuf->_len += len;

  /* null-terminate autobuf */
  autobuf->_buf[autobuf->_len] = 0;

  return 0;
}